

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_sort_key.cpp
# Opt level: O2

void duckdb::DecodeSortKeyStruct
               (DecodeSortKeyData *decode_data,DecodeSortKeyVectorData *vector_data,Vector *result,
               idx_t result_idx)

{
  data_t dVar1;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true> *this;
  reference this_00;
  reference vector_data_00;
  type result_00;
  idx_t c;
  ulong __n;
  
  dVar1 = decode_data->data[decode_data->position];
  decode_data->position = decode_data->position + 1;
  if (dVar1 == vector_data->null_byte) {
    FlatVector::VerifyFlatVector(result);
    TemplatedValidityMask<unsigned_long>::SetInvalid
              (&(result->validity).super_TemplatedValidityMask<unsigned_long>,result_idx);
  }
  this = StructVector::GetEntries(result);
  for (__n = 0; __n < (ulong)((long)(this->
                                    super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                    ).
                                    super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->
                                    super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                    ).
                                    super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3); __n = __n + 1)
  {
    this_00 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
              ::get<true>(this,__n);
    vector_data_00 =
         vector<duckdb::DecodeSortKeyVectorData,_true>::get<true>(&vector_data->child_data,__n);
    result_00 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                          (this_00);
    DecodeSortKeyRecursive(decode_data,vector_data_00,result_00,result_idx);
  }
  return;
}

Assistant:

void DecodeSortKeyStruct(DecodeSortKeyData &decode_data, DecodeSortKeyVectorData &vector_data, Vector &result,
                         idx_t result_idx) {
	// check if the top-level is valid or not
	auto validity_byte = decode_data.data[decode_data.position];
	decode_data.position++;
	if (validity_byte == vector_data.null_byte) {
		// entire struct is NULL
		// note that we still deserialize the children
		FlatVector::Validity(result).SetInvalid(result_idx);
	}
	// recurse into children
	auto &child_entries = StructVector::GetEntries(result);
	for (idx_t c = 0; c < child_entries.size(); c++) {
		auto &child_entry = child_entries[c];
		DecodeSortKeyRecursive(decode_data, vector_data.child_data[c], *child_entry, result_idx);
	}
}